

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::consumeRedirectedResponse
          (RpcCallContext *this)

{
  bool bVar1;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> **ppOVar2;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse> from;
  RpcCallContext *in_RSI;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t> OVar3;
  Fault local_88;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *local_80;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *_kj_result;
  MessageSize local_60;
  Maybe<capnp::MessageSize> local_50;
  Fault local_28;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  RpcCallContext *this_local;
  
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&in_RSI->redirectResults);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&f);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xc30,FAILED,"redirectResults","_kjCondition,",(DebugExpression<bool_&> *)&f);
    kj::_::Debug::Fault::fatal(&local_28);
  }
  bVar1 = kj::
          Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>_>
          ::operator==(&in_RSI->response);
  if (bVar1) {
    local_60.wordCount = 0;
    local_60.capCount = 0;
    kj::Maybe<capnp::MessageSize>::Maybe(&local_50,&local_60);
    getResults((Builder *)&_kj_result,in_RSI,&local_50);
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_50);
  }
  local_80 = kj::_::
             readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,decltype(nullptr)>
                       (&in_RSI->response);
  if (local_80 ==
      (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *)0x0) {
    kj::_::Debug::Fault::Fault
              (&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xc36,FAILED,"response != nullptr","");
    kj::_::Debug::Fault::fatal(&local_88);
  }
  ppOVar2 = kj::
            mv<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,decltype(nullptr)>*>
                      (&local_80);
  from = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::
         operator*(*ppOVar2);
  kj::
  downcast<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse>
            (from);
  OVar3 = LocallyRedirectedRpcResponse::addRef((LocallyRedirectedRpcResponse *)this);
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

kj::Own<RpcResponse> consumeRedirectedResponse() {
      KJ_ASSERT(redirectResults);

      if (response == kj::none) getResults(MessageSize{0, 0});  // force initialization of response

      // Note that the context needs to keep its own reference to the response so that it doesn't
      // get GC'd until the PipelineHook drops its reference to the context.
      return kj::downcast<LocallyRedirectedRpcResponse>(*KJ_ASSERT_NONNULL(response)).addRef();
    }